

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall
SuiteDataDictionaryTests::TestdataDictionaryValidate_UnSupportedVersion::
~TestdataDictionaryValidate_UnSupportedVersion(TestdataDictionaryValidate_UnSupportedVersion *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(dataDictionaryValidate_UnSupportedVersion) {
  DataDictionary dictionary;
  dictionary.addHeaderField(FIELD::BeginString, true);
  dictionary.addHeaderField(FIELD::MsgType, true);
  dictionary.setVersion("FIX.1000");

  FIX::Message msg;
  msg.getHeader().setField(BeginString(BeginString_FIX40));
  msg.getHeader().setField(MsgType(MsgType_NewOrderSingle));

  CHECK_THROW(DataDictionary::validate(msg, &dictionary, &dictionary), UnsupportedVersion);
}